

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O3

int do_op(em8051 *aCPU)

{
  int iVar1;
  
  iVar1 = (*(code *)(&DAT_0010b26c +
                    *(int *)(&DAT_0010b26c +
                            (ulong)aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC] *
                            4)))();
  return iVar1;
}

Assistant:

int do_op(struct em8051 *aCPU)
{
    switch (OPCODE)
    {
    case 0x00: return nop(aCPU);
    case 0x01: return ajmp_offset(aCPU);
    case 0x02: return ljmp_address(aCPU);
    case 0x03: return rr_a(aCPU);
    case 0x04: return inc_a(aCPU);
    case 0x05: return inc_mem(aCPU);
    case 0x06: return inc_indir_rx(aCPU);
    case 0x07: return inc_indir_rx(aCPU);

    case 0x08:
    case 0x09:
    case 0x0a:
    case 0x0b:
    case 0x0c:
    case 0x0d:
    case 0x0e:
    case 0x0f: return inc_rx(aCPU);

    case 0x10: return jbc_bitaddr_offset(aCPU);
    case 0x11: return acall_offset(aCPU);
    case 0x12: return lcall_address(aCPU);
    case 0x13: return rrc_a(aCPU);
    case 0x14: return dec_a(aCPU);
    case 0x15: return dec_mem(aCPU);
    case 0x16: return dec_indir_rx(aCPU);
    case 0x17: return dec_indir_rx(aCPU);

    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f: return dec_rx(aCPU);

    case 0x20: return jb_bitaddr_offset(aCPU);
    case 0x21: return ajmp_offset(aCPU);
    case 0x22: return ret(aCPU);
    case 0x23: return rl_a(aCPU);
    case 0x24: return add_a_imm(aCPU);
    case 0x25: return add_a_mem(aCPU);
    case 0x26: return add_a_indir_rx(aCPU);
    case 0x27: return add_a_indir_rx(aCPU);

    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f: return add_a_rx(aCPU);

    case 0x30: return jnb_bitaddr_offset(aCPU);
    case 0x31: return acall_offset(aCPU);
    case 0x32: return reti(aCPU);
    case 0x33: return rlc_a(aCPU);
    case 0x34: return addc_a_imm(aCPU);
    case 0x35: return addc_a_mem(aCPU);
    case 0x36: return addc_a_indir_rx(aCPU);
    case 0x37: return addc_a_indir_rx(aCPU);

    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f: return addc_a_rx(aCPU);

    case 0x40: return jc_offset(aCPU);
    case 0x41: return ajmp_offset(aCPU);
    case 0x42: return orl_mem_a(aCPU);
    case 0x43: return orl_mem_imm(aCPU);
    case 0x44: return orl_a_imm(aCPU);
    case 0x45: return orl_a_mem(aCPU);
    case 0x46: return orl_a_indir_rx(aCPU);
    case 0x47: return orl_a_indir_rx(aCPU);

    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f: return orl_a_rx(aCPU);

    case 0x50: return jnc_offset(aCPU);
    case 0x51: return acall_offset(aCPU);
    case 0x52: return anl_mem_a(aCPU);
    case 0x53: return anl_mem_imm(aCPU);
    case 0x54: return anl_a_imm(aCPU);
    case 0x55: return anl_a_mem(aCPU);
    case 0x56: return anl_a_indir_rx(aCPU);
    case 0x57: return anl_a_indir_rx(aCPU);

    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f: return anl_a_rx(aCPU);

    case 0x60: return jz_offset(aCPU);
    case 0x61: return ajmp_offset(aCPU);
    case 0x62: return xrl_mem_a(aCPU);
    case 0x63: return xrl_mem_imm(aCPU);
    case 0x64: return xrl_a_imm(aCPU);
    case 0x65: return xrl_a_mem(aCPU);
    case 0x66: return xrl_a_indir_rx(aCPU);
    case 0x67: return xrl_a_indir_rx(aCPU);

    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f: return xrl_a_rx(aCPU);

    case 0x70: return jnz_offset(aCPU);
    case 0x71: return acall_offset(aCPU);
    case 0x72: return orl_c_bitaddr(aCPU);
    case 0x73: return jmp_indir_a_dptr(aCPU);
    case 0x74: return mov_a_imm(aCPU);
    case 0x75: return mov_mem_imm(aCPU);
    case 0x76: return mov_indir_rx_imm(aCPU);
    case 0x77: return mov_indir_rx_imm(aCPU);

    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f: return mov_rx_imm(aCPU);

    case 0x80: return sjmp_offset(aCPU);
    case 0x81: return ajmp_offset(aCPU);
    case 0x82: return anl_c_bitaddr(aCPU);
    case 0x83: return movc_a_indir_a_pc(aCPU);
    case 0x84: return div_ab(aCPU);
    case 0x85: return mov_mem_mem(aCPU);
    case 0x86: return mov_mem_indir_rx(aCPU);
    case 0x87: return mov_mem_indir_rx(aCPU);

    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f: return mov_mem_rx(aCPU);

    case 0x90: return mov_dptr_imm(aCPU);
    case 0x91: return acall_offset(aCPU);
    case 0x92: return mov_bitaddr_c(aCPU);
    case 0x93: return movc_a_indir_a_dptr(aCPU);
    case 0x94: return subb_a_imm(aCPU);
    case 0x95: return subb_a_mem(aCPU);
    case 0x96: return subb_a_indir_rx(aCPU);
    case 0x97: return subb_a_indir_rx(aCPU);

    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f: return subb_a_rx(aCPU);

    case 0xa0: return orl_c_compl_bitaddr(aCPU);
    case 0xa1: return ajmp_offset(aCPU);
    case 0xa2: return mov_c_bitaddr(aCPU);
    case 0xa3: return inc_dptr(aCPU);
    case 0xa4: return mul_ab(aCPU);
    case 0xa5: return nop(aCPU); // unused
    case 0xa6: return mov_indir_rx_mem(aCPU);
    case 0xa7: return mov_indir_rx_mem(aCPU);

    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf: return mov_rx_mem(aCPU);

    case 0xb0: return anl_c_compl_bitaddr(aCPU);
    case 0xb1: return acall_offset(aCPU);
    case 0xb2: return cpl_bitaddr(aCPU);
    case 0xb3: return cpl_c(aCPU);
    case 0xb4: return cjne_a_imm_offset(aCPU);
    case 0xb5: return cjne_a_mem_offset(aCPU);
    case 0xb6: return cjne_indir_rx_imm_offset(aCPU);
    case 0xb7: return cjne_indir_rx_imm_offset(aCPU);

    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf: return cjne_rx_imm_offset(aCPU);

    case 0xc0: return push_mem(aCPU);
    case 0xc1: return ajmp_offset(aCPU);
    case 0xc2: return clr_bitaddr(aCPU);
    case 0xc3: return clr_c(aCPU);
    case 0xc4: return swap_a(aCPU);
    case 0xc5: return xch_a_mem(aCPU);
    case 0xc6: return xch_a_indir_rx(aCPU);
    case 0xc7: return xch_a_indir_rx(aCPU);

    case 0xc8:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf: return xch_a_rx(aCPU);

    case 0xd0: return pop_mem(aCPU);
    case 0xd1: return acall_offset(aCPU);
    case 0xd2: return setb_bitaddr(aCPU);
    case 0xd3: return setb_c(aCPU);
    case 0xd4: return da_a(aCPU);
    case 0xd5: return djnz_mem_offset(aCPU);
    case 0xd6: return xchd_a_indir_rx(aCPU);
    case 0xd7: return xchd_a_indir_rx(aCPU);

    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf: return djnz_rx_offset(aCPU);

    case 0xe0: return movx_a_indir_dptr(aCPU);
    case 0xe1: return ajmp_offset(aCPU);
    case 0xe2: return movx_a_indir_rx(aCPU);
    case 0xe3: return movx_a_indir_rx(aCPU);
    case 0xe4: return clr_a(aCPU);
    case 0xe5: return mov_a_mem(aCPU);
    case 0xe6: return mov_a_indir_rx(aCPU);
    case 0xe7: return mov_a_indir_rx(aCPU);

    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef: return mov_a_rx(aCPU);

    case 0xf0: return movx_indir_dptr_a(aCPU);
    case 0xf1: return acall_offset(aCPU);
    case 0xf2: return movx_indir_rx_a(aCPU);
    case 0xf3: return movx_indir_rx_a(aCPU);
    case 0xf4: return cpl_a(aCPU);
    case 0xf5: return mov_mem_a(aCPU);
    case 0xf6: return mov_indir_rx_a(aCPU);
    case 0xf7: return mov_indir_rx_a(aCPU);

    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff: return mov_rx_a(aCPU);
   }
    return 0;
}